

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void __thiscall mat_lib::matrix<double>::copy_elements__(matrix<double> *this,matrix<double> *m)

{
  size_t sVar1;
  size_t sVar2;
  element_t *peVar3;
  element_t *peVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  
  sVar1 = m->rows__;
  this->rows__ = sVar1;
  sVar2 = m->columns__;
  this->columns__ = sVar2;
  if (sVar1 != 0) {
    peVar3 = m->elements__;
    peVar4 = this->elements__;
    sVar6 = 0;
    do {
      if (sVar2 != 0) {
        lVar7 = 0;
        sVar8 = sVar2;
        do {
          lVar5 = (lVar7 >> 0x20) + sVar6 * sVar2;
          peVar4[lVar5] = peVar3[lVar5];
          lVar7 = lVar7 + 0x100000000;
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != sVar1);
  }
  return;
}

Assistant:

void copy_elements__(const matrix& m)
      { 
        rows__=m.rows__; columns__=m.columns__;
        for(size_t i=0; i<rows__; i++) 
          for(size_t j=0; j<columns__; j++) elements__[offset__(i,j)]=m.elements__[offset__(i,j)]; 
      }